

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall
CConsole::RegisterTemp(CConsole *this,char *pName,char *pParams,int Flags,char *pHelp)

{
  CConsole *this_00;
  void *pvVar1;
  char *pcVar2;
  undefined4 in_ECX;
  CCommand *in_RDI;
  char *pMem;
  CCommand *pCommand;
  char *in_stack_ffffffffffffffb8;
  CCommand *in_stack_ffffffffffffffc8;
  uint Size;
  CHeap *in_stack_ffffffffffffffd0;
  CConsole *this_01;
  
  if (*(long *)&in_RDI[1].super_CCommandInfo.m_AccessLevel == 0) {
    this_00 = (CConsole *)
              CHeap::Allocate(in_stack_ffffffffffffffd0,
                              (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    Size = (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    CCommand::CCommand(in_RDI,SUB81((ulong)this_00 >> 0x38,0));
    this_01 = this_00;
    pvVar1 = CHeap::Allocate((CHeap *)this_00,Size);
    str_copy((char *)in_RDI,(char *)this_00,0);
    *(void **)&this_01->m_FlagMask = pvVar1;
    pcVar2 = (char *)CHeap::Allocate((CHeap *)this_01,(uint)((ulong)pvVar1 >> 0x20));
    str_copy((char *)in_RDI,(char *)this_00,0);
    this_01->m_paStrokeStr[0] = pcVar2;
    in_stack_ffffffffffffffc8 =
         (CCommand *)CHeap::Allocate((CHeap *)this_01,(uint)((ulong)pcVar2 >> 0x20));
    str_copy((char *)in_RDI,(char *)this_00,0);
    this_01->m_paStrokeStr[1] = (char *)in_stack_ffffffffffffffc8;
  }
  else {
    this_01 = *(CConsole **)&in_RDI[1].super_CCommandInfo.m_AccessLevel;
    str_copy((char *)in_RDI,in_stack_ffffffffffffffb8,0);
    str_copy((char *)in_RDI,in_stack_ffffffffffffffb8,0);
    str_copy((char *)in_RDI,in_stack_ffffffffffffffb8,0);
    *(undefined8 *)&in_RDI[1].super_CCommandInfo.m_AccessLevel =
         *(undefined8 *)(*(long *)&in_RDI[1].super_CCommandInfo.m_AccessLevel + 0x28);
  }
  this_01->m_pConfig = (CConfig *)0x0;
  this_01->m_pStorage = (IStorage *)0x0;
  *(undefined4 *)&this_01->m_pFirstExec = in_ECX;
  *(undefined1 *)((long)&this_01->m_pFirstExec + 4) = 1;
  AddCommandSorted(this_01,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void CConsole::RegisterTemp(const char *pName, const char *pParams,	int Flags, const char *pHelp)
{
	CCommand *pCommand;
	if(m_pRecycleList)
	{
		pCommand = m_pRecycleList;
		str_copy(const_cast<char *>(pCommand->m_pName), pName, TEMPCMD_NAME_LENGTH);
		str_copy(const_cast<char *>(pCommand->m_pHelp), pHelp, TEMPCMD_HELP_LENGTH);
		str_copy(const_cast<char *>(pCommand->m_pParams), pParams, TEMPCMD_PARAMS_LENGTH);

		m_pRecycleList = m_pRecycleList->m_pNext;
	}
	else
	{
		pCommand = new(m_TempCommands.Allocate(sizeof(CCommand))) CCommand(false);
		char *pMem = static_cast<char *>(m_TempCommands.Allocate(TEMPCMD_NAME_LENGTH));
		str_copy(pMem, pName, TEMPCMD_NAME_LENGTH);
		pCommand->m_pName = pMem;
		pMem = static_cast<char *>(m_TempCommands.Allocate(TEMPCMD_HELP_LENGTH));
		str_copy(pMem, pHelp, TEMPCMD_HELP_LENGTH);
		pCommand->m_pHelp = pMem;
		pMem = static_cast<char *>(m_TempCommands.Allocate(TEMPCMD_PARAMS_LENGTH));
		str_copy(pMem, pParams, TEMPCMD_PARAMS_LENGTH);
		pCommand->m_pParams = pMem;
	}

	pCommand->m_pfnCallback = 0;
	pCommand->m_pUserData = 0;
	pCommand->m_Flags = Flags;
	pCommand->m_Temp = true;

	AddCommandSorted(pCommand);
}